

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

void __thiscall
pbrt::ShapeSceneEntity::ShapeSceneEntity
          (ShapeSceneEntity *this,string *name,ParameterDictionary *parameters,FileLoc loc,
          Transform *renderFromObject,Transform *objectFromRender,bool reverseOrientation,
          int materialIndex,string *materialName,int lightIndex,string *insideMedium,
          string *outsideMedium)

{
  ParameterDictionary parameters_00;
  undefined1 in_stack_ffffffffffffff60 [80];
  FileLoc in_stack_ffffffffffffffb0;
  
  ParameterDictionary::ParameterDictionary
            ((ParameterDictionary *)&stack0xffffffffffffff68,parameters);
  parameters_00._24_80_ = in_stack_ffffffffffffff60;
  parameters_00.params._0_24_ = loc;
  SceneEntity::SceneEntity(&this->super_SceneEntity,name,parameters_00,in_stack_ffffffffffffffb0);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)&stack0xffffffffffffff68);
  this->renderFromObject = renderFromObject;
  this->objectFromRender = objectFromRender;
  this->reverseOrientation = reverseOrientation;
  this->materialIndex = materialIndex;
  std::__cxx11::string::string((string *)&this->materialName,(string *)materialName);
  this->lightIndex = lightIndex;
  std::__cxx11::string::string((string *)&this->insideMedium,(string *)insideMedium);
  std::__cxx11::string::string((string *)&this->outsideMedium,(string *)outsideMedium);
  return;
}

Assistant:

ShapeSceneEntity(const std::string &name, ParameterDictionary parameters, FileLoc loc,
                     const Transform *renderFromObject, const Transform *objectFromRender,
                     bool reverseOrientation, int materialIndex,
                     const std::string &materialName, int lightIndex,
                     const std::string &insideMedium, const std::string &outsideMedium)
        : SceneEntity(name, parameters, loc),
          renderFromObject(renderFromObject),
          objectFromRender(objectFromRender),
          reverseOrientation(reverseOrientation),
          materialIndex(materialIndex),
          materialName(materialName),
          lightIndex(lightIndex),
          insideMedium(insideMedium),
          outsideMedium(outsideMedium) {}